

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.h
# Opt level: O0

void __thiscall Assimp::Blender::Tex::Tex(Tex *this)

{
  Tex *this_local;
  
  ElemBase::ElemBase(&this->super_ElemBase);
  (this->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Tex_0104d900;
  ID::ID(&this->id);
  this->imaflag = ImageFlags_INTERPOL;
  this->type = Type_CLOUDS;
  ::std::shared_ptr<Assimp::Blender::Image>::shared_ptr(&this->ima);
  return;
}

Assistant:

Tex()
    : ElemBase()
    , imaflag( ImageFlags_INTERPOL )
    , type( Type_CLOUDS )
    , ima() {
        // empty
    }